

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O2

int __thiscall ncnn::Gemm_x86_avx::create_pipeline_int8(Gemm_x86_avx *this,Option *opt)

{
  Mat *pMVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  Allocator *pAVar6;
  size_t sVar7;
  int max_ii;
  Option *pOVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int *piVar12;
  int iVar13;
  undefined1 (*pauVar14) [16];
  undefined1 *puVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  Gemm_x86_avx *pGVar19;
  long lVar20;
  Gemm_x86_avx *pGVar21;
  int iVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  long lVar25;
  long lVar26;
  undefined8 *puVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  long local_160;
  long local_158;
  long local_150;
  long local_140;
  long local_138;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  long local_108;
  long local_100;
  Option *local_f8;
  ulong local_f0;
  Gemm_x86_avx *local_e8;
  Mat local_e0;
  ulong local_98;
  long local_90;
  long local_88;
  long local_80;
  int local_78;
  int local_74;
  long local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  pGVar19 = this;
  local_f8 = opt;
  local_e8 = this;
  if ((this->super_Gemm).constantA == 0) {
LAB_00475788:
    pGVar21 = pGVar19;
    if ((pGVar19->super_Gemm).constantB != 0) {
      uVar3 = (pGVar19->super_Gemm).constantN;
      uVar4 = (pGVar19->super_Gemm).constantK;
      get_optimal_tile_mnk_int8
                (0,uVar3,uVar4,(pGVar19->super_Gemm).constant_TILE_M,
                 (pGVar19->super_Gemm).constant_TILE_N,(pGVar19->super_Gemm).constant_TILE_K,&TILE_M
                 ,&TILE_N,&TILE_K,local_f8->num_threads);
      iVar10 = TILE_K;
      iVar13 = (int)(uVar3 + TILE_N + -1) / TILE_N;
      local_98 = (ulong)uVar4;
      local_68 = (ulong)uVar3;
      Mat::create(&pGVar19->BT_data,TILE_N * TILE_K,(int)(uVar4 + TILE_K + -1) / TILE_K,iVar13,1,
                  (Allocator *)0x0);
      if (((pGVar19->BT_data).data == (void *)0x0) ||
         ((long)(pGVar19->BT_data).c * (pGVar19->BT_data).cstep == 0)) goto LAB_00476380;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      pMVar1 = &(pGVar19->super_Gemm).B_data;
      iVar22 = 0;
      local_78 = iVar13;
      while (iVar22 != local_78) {
        iVar13 = TILE_N * iVar22;
        iVar37 = (int)local_68 - iVar13;
        lVar17 = (long)iVar13;
        local_70 = lVar17 + 1;
        local_38 = lVar17 + 2;
        local_40 = lVar17 + 3;
        local_48 = lVar17 + 4;
        local_50 = lVar17 + 5;
        local_58 = lVar17 + 6;
        local_60 = lVar17 + 7;
        local_74 = iVar22;
        for (iVar9 = 0; iVar22 = (int)local_98 - iVar9, iVar22 != 0 && iVar9 <= (int)local_98;
            iVar9 = iVar9 + TILE_K) {
          iVar34 = iVar37;
          if (TILE_N < iVar37) {
            iVar34 = TILE_N;
          }
          if (iVar10 < iVar22) {
            iVar22 = iVar10;
          }
          local_e0.elemsize = (pGVar21->BT_data).elemsize;
          local_e0.w = (pGVar21->BT_data).w;
          local_e0.cstep = (size_t)local_e0.w;
          local_e0.elempack = (pGVar21->BT_data).elempack;
          local_e0.allocator = (pGVar21->BT_data).allocator;
          local_e0.data =
               (void *)((long)(pGVar21->BT_data).data +
                       local_e0.elemsize * local_e0.cstep * (long)(iVar9 / iVar10) +
                       (long)(iVar13 / TILE_N) * (pGVar21->BT_data).cstep * local_e0.elemsize);
          local_e0.refcount = (int *)0x0;
          local_e0.dims = 2;
          local_e0.h = 1;
          local_e0.d = 1;
          local_e0.c = 1;
          lVar31 = (long)iVar9;
          lVar18 = (long)iVar34;
          if ((pGVar21->super_Gemm).transB == 0) {
            iVar10 = cpu_support_x86_avx_vnni_int8();
            if (iVar10 == 0) {
              iVar10 = cpu_support_x86_avx_vnni();
              if (iVar10 == 0) {
                iVar10 = cpu_support_x86_avx2();
                if (iVar10 == 0) {
                  iVar10 = (pGVar21->super_Gemm).B_data.w;
                  lVar29 = (long)iVar10;
                  lVar26 = (long)(iVar10 * 2);
                  local_160 = lVar17 + lVar29;
                  lVar11 = (iVar10 + 3) + lVar17;
                  lVar16 = (iVar10 + 2) + lVar17;
                  lVar28 = (iVar10 + 1) + lVar17;
                  local_138 = local_70;
                  pauVar14 = (undefined1 (*) [16])local_e0.data;
                  lVar36 = lVar17;
                  for (uVar23 = 0; (long)(uVar23 | 7) < lVar18; uVar23 = uVar23 + 8) {
                    lVar20 = (pGVar21->super_Gemm).B_data.w * lVar31 *
                             (pGVar21->super_Gemm).B_data.elemsize;
                    pvVar5 = (pGVar21->super_Gemm).B_data.data;
                    lVar38 = (long)pvVar5 + lVar36;
                    lVar25 = (long)pvVar5 + local_160;
                    for (iVar10 = 0; iVar10 + 1 < iVar22; iVar10 = iVar10 + 2) {
                      auVar40._8_8_ = 0;
                      auVar40._0_8_ = *(ulong *)(lVar38 + lVar20);
                      auVar41._8_8_ = 0;
                      auVar41._0_8_ = *(ulong *)(lVar25 + lVar20);
                      auVar40 = vpunpcklbw_avx(auVar40,auVar41);
                      *pauVar14 = auVar40;
                      pauVar14 = pauVar14 + 1;
                      lVar38 = lVar38 + lVar26;
                      lVar25 = lVar25 + lVar26;
                    }
                    puVar27 = (undefined8 *)(lVar38 + lVar20);
                    for (; iVar10 < iVar22; iVar10 = iVar10 + 1) {
                      *(undefined8 *)*pauVar14 = *puVar27;
                      pauVar14 = (undefined1 (*) [16])(*pauVar14 + 8);
                      puVar27 = (undefined8 *)((long)puVar27 + lVar29);
                    }
                    lVar36 = lVar36 + 8;
                    local_160 = local_160 + 8;
                    lVar11 = lVar11 + 8;
                    lVar16 = lVar16 + 8;
                    lVar28 = lVar28 + 8;
                    local_138 = local_138 + 8;
                    pGVar21 = local_e8;
                  }
                  for (; lVar25 = lVar28, lVar38 = lVar11, (long)(uVar23 | 3) < lVar18;
                      uVar23 = uVar23 + 4) {
                    pvVar5 = (pGVar21->super_Gemm).B_data.data;
                    lVar30 = (pGVar21->super_Gemm).B_data.w * lVar31 *
                             (pGVar21->super_Gemm).B_data.elemsize;
                    lVar11 = (long)pvVar5 + lVar36;
                    lVar20 = lVar38 + (long)pvVar5;
                    lVar33 = lVar16 + (long)pvVar5;
                    lVar35 = lVar25 + (long)pvVar5;
                    lVar28 = (long)pvVar5 + local_160;
                    puVar15 = (undefined1 *)((long)pvVar5 + lVar30 + local_138);
                    for (iVar10 = 1; iVar10 < iVar22; iVar10 = iVar10 + 2) {
                      (*pauVar14)[0] = *(undefined1 *)(lVar11 + lVar30);
                      (*pauVar14)[1] = *(undefined1 *)(lVar28 + lVar30);
                      (*pauVar14)[2] = *(undefined1 *)(lVar11 + 1 + lVar30);
                      (*pauVar14)[3] = *(undefined1 *)(lVar35 + lVar30);
                      (*pauVar14)[4] = *(undefined1 *)(lVar11 + 2 + lVar30);
                      (*pauVar14)[5] = *(undefined1 *)(lVar33 + lVar30);
                      (*pauVar14)[6] = *(undefined1 *)(lVar11 + 3 + lVar30);
                      (*pauVar14)[7] = *(undefined1 *)(lVar20 + lVar30);
                      pauVar14 = (undefined1 (*) [16])(*pauVar14 + 8);
                      lVar11 = lVar11 + lVar26;
                      lVar20 = lVar20 + lVar26;
                      lVar33 = lVar33 + lVar26;
                      lVar35 = lVar35 + lVar26;
                      lVar28 = lVar28 + lVar26;
                      puVar15 = puVar15 + lVar26;
                    }
                    for (iVar10 = iVar10 + -1; iVar10 < iVar22; iVar10 = iVar10 + 1) {
                      (*pauVar14)[0] = puVar15[-1];
                      (*pauVar14)[1] = *puVar15;
                      (*pauVar14)[2] = puVar15[1];
                      (*pauVar14)[3] = puVar15[2];
                      pauVar14 = (undefined1 (*) [16])(*pauVar14 + 4);
                      puVar15 = puVar15 + lVar29;
                    }
                    lVar36 = lVar36 + 4;
                    lVar16 = lVar16 + 4;
                    local_160 = local_160 + 4;
                    local_138 = local_138 + 4;
                    pGVar21 = local_e8;
                    lVar11 = lVar38 + 4;
                    lVar28 = lVar25 + 4;
                    local_108 = lVar38;
                    local_100 = lVar25;
                  }
                  for (; (long)(uVar23 | 1) < lVar18; uVar23 = uVar23 + 2) {
                    pvVar5 = (pGVar21->super_Gemm).B_data.data;
                    lVar38 = (pGVar21->super_Gemm).B_data.w * lVar31 *
                             (pGVar21->super_Gemm).B_data.elemsize;
                    lVar11 = (long)pvVar5 + lVar36;
                    lVar28 = (long)pvVar5 + lVar25;
                    lVar16 = (long)pvVar5 + local_160;
                    for (iVar10 = 1; iVar10 < iVar22; iVar10 = iVar10 + 2) {
                      (*pauVar14)[0] = *(undefined1 *)(lVar11 + lVar38);
                      (*pauVar14)[1] = *(undefined1 *)(lVar16 + lVar38);
                      (*pauVar14)[2] = *(undefined1 *)(lVar11 + 1 + lVar38);
                      (*pauVar14)[3] = *(undefined1 *)(lVar28 + lVar38);
                      pauVar14 = (undefined1 (*) [16])(*pauVar14 + 4);
                      lVar11 = lVar11 + lVar26;
                      lVar28 = lVar28 + lVar26;
                      lVar16 = lVar16 + lVar26;
                    }
                    for (iVar10 = iVar10 + -1; iVar10 < iVar22; iVar10 = iVar10 + 1) {
                      (*pauVar14)[0] = *(undefined1 *)(lVar11 + lVar38);
                      (*pauVar14)[1] = *(undefined1 *)(lVar11 + 1 + lVar38);
                      pauVar14 = (undefined1 (*) [16])(*pauVar14 + 2);
                      lVar38 = lVar38 + lVar29;
                    }
                    lVar36 = lVar36 + 2;
                    lVar25 = lVar25 + 2;
                    local_160 = local_160 + 2;
                  }
                  if (iVar22 < 1) {
                    iVar22 = 0;
                  }
                  for (; (long)uVar23 < lVar18; uVar23 = uVar23 + 1) {
                    puVar15 = (undefined1 *)
                              ((long)(pGVar21->super_Gemm).B_data.data +
                              lVar17 + uVar23 +
                              (pGVar21->super_Gemm).B_data.w * lVar31 *
                              (pGVar21->super_Gemm).B_data.elemsize);
                    iVar10 = iVar22;
                    while (bVar39 = iVar10 != 0, iVar10 = iVar10 + -1, bVar39) {
                      (*pauVar14)[0] = *puVar15;
                      pauVar14 = (undefined1 (*) [16])(*pauVar14 + 1);
                      puVar15 = puVar15 + lVar29;
                    }
                  }
                }
                else {
                  transpose_pack_B_tile_int8_avx2(pMVar1,&local_e0,iVar13,iVar34,iVar9,iVar22);
                }
              }
              else {
                transpose_pack_B_tile_int8_avxvnni(pMVar1,&local_e0,iVar13,iVar34,iVar9,iVar22);
              }
            }
            else {
              transpose_pack_B_tile_int8_avxvnniint8(pMVar1,&local_e0,iVar13,iVar34,iVar9,iVar22);
            }
          }
          else {
            iVar10 = cpu_support_x86_avx_vnni_int8();
            if (iVar10 == 0) {
              iVar10 = cpu_support_x86_avx_vnni();
              if (iVar10 == 0) {
                iVar10 = cpu_support_x86_avx2();
                if (iVar10 == 0) {
                  local_138 = local_58;
                  local_100 = local_50;
                  local_108 = local_48;
                  local_160 = local_40;
                  local_150 = local_38;
                  pauVar14 = (undefined1 (*) [16])local_e0.data;
                  lVar36 = local_60;
                  lVar11 = local_70;
                  uVar23 = 0;
                  lVar28 = lVar17;
                  while (lVar26 = lVar28, uVar32 = uVar23, lVar29 = lVar11,
                        (long)(uVar32 | 7) < lVar18) {
                    sVar7 = (pGVar21->super_Gemm).B_data.elemsize;
                    local_90 = (long)(pGVar21->super_Gemm).B_data.w;
                    pvVar5 = (pGVar21->super_Gemm).B_data.data;
                    lVar11 = sVar7 * lVar26 * local_90 + lVar31;
                    lVar28 = sVar7 * lVar29 * local_90 + lVar31;
                    lVar16 = sVar7 * local_150 * local_90 + lVar31;
                    lVar38 = sVar7 * local_160 * local_90 + lVar31;
                    lVar25 = sVar7 * local_108 * local_90 + lVar31;
                    lVar20 = sVar7 * local_100 * local_90 + lVar31;
                    lVar33 = sVar7 * local_138 * local_90 + lVar31;
                    lVar35 = sVar7 * lVar36 * local_90 + lVar31;
                    pauVar24 = pauVar14;
                    for (lVar30 = 0; (int)lVar30 + 1 < iVar22; lVar30 = lVar30 + 2) {
                      (*pauVar14)[lVar30 * 8] = *(undefined1 *)((long)pvVar5 + lVar30 + lVar11);
                      (*pauVar14)[lVar30 * 8 + 1] =
                           *(undefined1 *)((long)pvVar5 + lVar30 + lVar11 + 1);
                      (*pauVar14)[lVar30 * 8 + 2] = *(undefined1 *)((long)pvVar5 + lVar30 + lVar28);
                      (*pauVar14)[lVar30 * 8 + 3] =
                           *(undefined1 *)((long)pvVar5 + lVar30 + lVar28 + 1);
                      (*pauVar14)[lVar30 * 8 + 4] = *(undefined1 *)((long)pvVar5 + lVar30 + lVar16);
                      (*pauVar14)[lVar30 * 8 + 5] =
                           *(undefined1 *)((long)pvVar5 + lVar30 + lVar16 + 1);
                      (*pauVar14)[lVar30 * 8 + 6] = *(undefined1 *)((long)pvVar5 + lVar30 + lVar38);
                      (*pauVar14)[lVar30 * 8 + 7] =
                           *(undefined1 *)((long)pvVar5 + lVar30 + lVar38 + 1);
                      (*pauVar14)[lVar30 * 8 + 8] = *(undefined1 *)((long)pvVar5 + lVar30 + lVar25);
                      (*pauVar14)[lVar30 * 8 + 9] =
                           *(undefined1 *)((long)pvVar5 + lVar30 + lVar25 + 1);
                      (*pauVar14)[lVar30 * 8 + 10] = *(undefined1 *)((long)pvVar5 + lVar30 + lVar20)
                      ;
                      (*pauVar14)[lVar30 * 8 + 0xb] =
                           *(undefined1 *)((long)pvVar5 + lVar30 + lVar20 + 1);
                      (*pauVar14)[lVar30 * 8 + 0xc] =
                           *(undefined1 *)((long)pvVar5 + lVar30 + lVar33);
                      (*pauVar14)[lVar30 * 8 + 0xd] =
                           *(undefined1 *)((long)pvVar5 + lVar30 + lVar33 + 1);
                      (*pauVar14)[lVar30 * 8 + 0xe] =
                           *(undefined1 *)((long)pvVar5 + lVar30 + lVar35);
                      (*pauVar14)[lVar30 * 8 + 0xf] =
                           *(undefined1 *)((long)pvVar5 + lVar30 + lVar35 + 1);
                      pauVar24 = pauVar24 + 1;
                    }
                    lVar11 = sVar7 * local_90;
                    pauVar14 = pauVar24;
                    for (; (int)lVar30 < iVar22; lVar30 = lVar30 + 1) {
                      puVar15 = (undefined1 *)((long)pvVar5 + lVar30 + lVar11 * lVar26 + lVar31);
                      (*pauVar14)[0] = *puVar15;
                      (*pauVar14)[1] = puVar15[lVar11];
                      (*pauVar14)[2] = puVar15[lVar11 * 2];
                      (*pauVar14)[3] = puVar15[lVar11 * 3];
                      (*pauVar14)[4] = puVar15[lVar11 * 4];
                      (*pauVar14)[5] = puVar15[lVar11 * 5];
                      (*pauVar14)[6] = puVar15[lVar11 * 6];
                      (*pauVar14)[7] = puVar15[lVar11 * 7];
                      pauVar14 = (undefined1 (*) [16])(*pauVar14 + 8);
                    }
                    local_150 = local_150 + 8;
                    local_160 = local_160 + 8;
                    local_108 = local_108 + 8;
                    local_100 = local_100 + 8;
                    local_138 = local_138 + 8;
                    lVar36 = lVar36 + 8;
                    pGVar21 = local_e8;
                    lVar11 = lVar29 + 8;
                    lVar28 = lVar26 + 8;
                    local_f0 = uVar32;
                    local_88 = lVar29;
                    local_80 = lVar26;
                    uVar23 = uVar32 + 8;
                  }
                  for (; (long)(uVar32 | 3) < lVar18; uVar32 = uVar32 + 4) {
                    sVar7 = (pGVar21->super_Gemm).B_data.elemsize;
                    lVar16 = (long)(pGVar21->super_Gemm).B_data.w;
                    pvVar5 = (pGVar21->super_Gemm).B_data.data;
                    lVar36 = sVar7 * lVar26 * lVar16 + lVar31;
                    lVar11 = sVar7 * lVar29 * lVar16 + lVar31;
                    lVar28 = sVar7 * local_150 * lVar16 + lVar31;
                    lVar16 = sVar7 * local_160 * lVar16 + lVar31;
                    pauVar24 = pauVar14;
                    for (lVar38 = 0; (int)lVar38 + 1 < iVar22; lVar38 = lVar38 + 2) {
                      (*pauVar14)[lVar38 * 4] = *(undefined1 *)((long)pvVar5 + lVar38 + lVar36);
                      (*pauVar14)[lVar38 * 4 + 1] =
                           *(undefined1 *)((long)pvVar5 + lVar38 + lVar36 + 1);
                      (*pauVar14)[lVar38 * 4 + 2] = *(undefined1 *)((long)pvVar5 + lVar38 + lVar11);
                      (*pauVar14)[lVar38 * 4 + 3] =
                           *(undefined1 *)((long)pvVar5 + lVar38 + lVar11 + 1);
                      (*pauVar14)[lVar38 * 4 + 4] = *(undefined1 *)((long)pvVar5 + lVar38 + lVar28);
                      (*pauVar14)[lVar38 * 4 + 5] =
                           *(undefined1 *)((long)pvVar5 + lVar38 + lVar28 + 1);
                      (*pauVar14)[lVar38 * 4 + 6] = *(undefined1 *)((long)pvVar5 + lVar38 + lVar16);
                      (*pauVar14)[lVar38 * 4 + 7] =
                           *(undefined1 *)((long)pvVar5 + lVar38 + lVar16 + 1);
                      pauVar24 = (undefined1 (*) [16])(*pauVar24 + 8);
                    }
                    for (; (int)lVar38 < iVar22; lVar38 = lVar38 + 1) {
                      (*pauVar14)[lVar38 * 4] = *(undefined1 *)((long)pvVar5 + lVar38 + lVar36);
                      (*pauVar14)[lVar38 * 4 + 1] = *(undefined1 *)((long)pvVar5 + lVar38 + lVar11);
                      (*pauVar14)[lVar38 * 4 + 2] = *(undefined1 *)((long)pvVar5 + lVar38 + lVar28);
                      (*pauVar14)[lVar38 * 4 + 3] = *(undefined1 *)((long)pvVar5 + lVar38 + lVar16);
                      pauVar24 = (undefined1 (*) [16])(*pauVar24 + 4);
                    }
                    lVar26 = lVar26 + 4;
                    lVar29 = lVar29 + 4;
                    local_150 = local_150 + 4;
                    local_160 = local_160 + 4;
                    pauVar14 = pauVar24;
                  }
                  for (; (long)(uVar32 | 1) < lVar18; uVar32 = uVar32 + 2) {
                    sVar7 = (pGVar21->super_Gemm).B_data.elemsize;
                    lVar11 = (long)(pGVar21->super_Gemm).B_data.w;
                    pvVar5 = (pGVar21->super_Gemm).B_data.data;
                    lVar36 = sVar7 * lVar26 * lVar11 + lVar31;
                    lVar11 = sVar7 * lVar29 * lVar11 + lVar31;
                    pauVar24 = pauVar14;
                    for (lVar28 = 0; (int)lVar28 + 1 < iVar22; lVar28 = lVar28 + 2) {
                      (*pauVar14)[lVar28 * 2] = *(undefined1 *)((long)pvVar5 + lVar28 + lVar36);
                      (*pauVar14)[lVar28 * 2 + 1] =
                           *(undefined1 *)((long)pvVar5 + lVar28 + lVar36 + 1);
                      (*pauVar14)[lVar28 * 2 + 2] = *(undefined1 *)((long)pvVar5 + lVar28 + lVar11);
                      (*pauVar14)[lVar28 * 2 + 3] =
                           *(undefined1 *)((long)pvVar5 + lVar28 + lVar11 + 1);
                      pauVar24 = (undefined1 (*) [16])(*pauVar24 + 4);
                    }
                    for (; pauVar14 = pauVar24, (int)lVar28 < iVar22; lVar28 = lVar28 + 1) {
                      (*pauVar14)[0] = *(undefined1 *)((long)pvVar5 + lVar28 + lVar36);
                      (*pauVar14)[1] = *(undefined1 *)((long)pvVar5 + lVar28 + lVar11);
                      pauVar24 = (undefined1 (*) [16])(*pauVar14 + 2);
                    }
                    lVar26 = lVar26 + 2;
                    lVar29 = lVar29 + 2;
                  }
                  if (iVar22 < 1) {
                    iVar22 = 0;
                  }
                  for (; (long)uVar32 < lVar18; uVar32 = uVar32 + 1) {
                    iVar10 = (pGVar21->super_Gemm).B_data.w;
                    pvVar5 = (pGVar21->super_Gemm).B_data.data;
                    sVar7 = (pGVar21->super_Gemm).B_data.elemsize;
                    for (lVar36 = 0; iVar22 != (int)lVar36; lVar36 = lVar36 + 1) {
                      (*pauVar14)[lVar36] =
                           *(undefined1 *)
                            ((long)pvVar5 + lVar36 + sVar7 * lVar26 * (long)iVar10 + lVar31);
                    }
                    pauVar14 = (undefined1 (*) [16])(*pauVar14 + lVar36);
                    lVar26 = lVar26 + 1;
                  }
                }
                else {
                  pack_B_tile_int8_avx2(pMVar1,&local_e0,iVar13,iVar34,iVar9,iVar22);
                }
              }
              else {
                pack_B_tile_int8_avxvnni(pMVar1,&local_e0,iVar13,iVar34,iVar9,iVar22);
              }
            }
            else {
              pack_B_tile_int8_avxvnniint8(pMVar1,&local_e0,iVar13,iVar34,iVar9,iVar22);
            }
          }
          if (local_e0.refcount != (int *)0x0) {
            LOCK();
            *local_e0.refcount = *local_e0.refcount + -1;
            UNLOCK();
            if (*local_e0.refcount == 0) {
              if (local_e0.allocator == (Allocator *)0x0) {
                free(local_e0.data);
              }
              else {
                (*(local_e0.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          iVar10 = TILE_K;
        }
        iVar22 = local_74 + 1;
      }
      if (local_f8->lightmode != false) {
        piVar12 = (pGVar21->super_Gemm).B_data.refcount;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            pAVar6 = (pGVar21->super_Gemm).B_data.allocator;
            if (pAVar6 == (Allocator *)0x0) {
              free((pGVar21->super_Gemm).B_data.data);
            }
            else {
              (*pAVar6->_vptr_Allocator[3])();
            }
          }
        }
        (pGVar21->super_Gemm).B_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(pGVar19->super_Gemm).B_data.refcount + 4) =
             (undefined1  [16])0x0;
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        (pGVar21->super_Gemm).B_data.dims = 0;
        (pGVar21->super_Gemm).B_data.w = 0;
        (pGVar21->super_Gemm).B_data.h = 0;
        (pGVar21->super_Gemm).B_data.d = 0;
        (pGVar21->super_Gemm).B_data.c = 0;
      }
    }
    pOVar8 = local_f8;
    if (((pGVar21->super_Gemm).constantC != 0) &&
       ((pGVar21->super_Gemm).constant_broadcast_type_C != -1)) {
      piVar12 = (pGVar21->super_Gemm).C_data.refcount;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + 1;
        UNLOCK();
      }
      piVar12 = (pGVar21->CT_data).refcount;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          pAVar6 = (pGVar21->CT_data).allocator;
          if (pAVar6 == (Allocator *)0x0) {
            free((pGVar21->CT_data).data);
          }
          else {
            (*pAVar6->_vptr_Allocator[3])();
          }
        }
      }
      auVar2._0_8_ = (pGVar21->super_Gemm).C_data.data;
      auVar2._8_8_ = (pGVar21->super_Gemm).C_data.refcount;
      (pGVar21->CT_data).data = (void *)auVar2._0_8_;
      (pGVar21->CT_data).refcount = (int *)auVar2._8_8_;
      (pGVar21->CT_data).elemsize = (pGVar21->super_Gemm).C_data.elemsize;
      (pGVar21->CT_data).elempack = (pGVar21->super_Gemm).C_data.elempack;
      (pGVar21->CT_data).allocator = (pGVar21->super_Gemm).C_data.allocator;
      iVar10 = (pGVar21->super_Gemm).C_data.w;
      iVar13 = (pGVar21->super_Gemm).C_data.h;
      iVar22 = (pGVar21->super_Gemm).C_data.d;
      (pGVar21->CT_data).dims = (pGVar21->super_Gemm).C_data.dims;
      (pGVar21->CT_data).w = iVar10;
      (pGVar21->CT_data).h = iVar13;
      (pGVar21->CT_data).d = iVar22;
      (pGVar21->CT_data).c = (pGVar21->super_Gemm).C_data.c;
      (pGVar21->CT_data).cstep = (pGVar21->super_Gemm).C_data.cstep;
      if (pOVar8->lightmode == true) {
        piVar12 = (int *)vpextrq_avx(auVar2,1);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            pAVar6 = (pGVar21->super_Gemm).C_data.allocator;
            if (pAVar6 == (Allocator *)0x0) {
              free((pGVar21->super_Gemm).C_data.data);
            }
            else {
              (*pAVar6->_vptr_Allocator[3])();
            }
          }
        }
        (pGVar21->super_Gemm).C_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(pGVar21->super_Gemm).C_data.refcount + 4) =
             (undefined1  [16])0x0;
        (pGVar21->super_Gemm).C_data.data = (void *)0x0;
        (pGVar21->super_Gemm).C_data.refcount = (int *)0x0;
        (pGVar21->super_Gemm).C_data.dims = 0;
        (pGVar21->super_Gemm).C_data.w = 0;
        (pGVar21->super_Gemm).C_data.h = 0;
        (pGVar21->super_Gemm).C_data.d = 0;
        (pGVar21->super_Gemm).C_data.c = 0;
      }
    }
    iVar10 = 0;
    if ((((pGVar21->super_Gemm).constantA != 0) || ((pGVar21->super_Gemm).constantB != 0)) ||
       ((pGVar21->super_Gemm).constantC != 0)) {
      *(int *)&(pGVar21->super_Gemm).field_0x244 = pOVar8->num_threads;
    }
  }
  else {
    uVar3 = (this->super_Gemm).constantM;
    uVar4 = (this->super_Gemm).constantK;
    local_f0 = (ulong)uVar4;
    get_optimal_tile_mnk_int8
              (uVar3,0,uVar4,(this->super_Gemm).constant_TILE_M,(this->super_Gemm).constant_TILE_N,
               (this->super_Gemm).constant_TILE_K,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
    iVar13 = TILE_M;
    iVar10 = TILE_K;
    iVar37 = (int)(uVar3 + TILE_M + -1) / TILE_M;
    iVar22 = iVar10;
    local_98 = (ulong)uVar3;
    if (3 < TILE_K) {
      iVar9 = cpu_support_x86_avx512_vnni();
      bVar39 = true;
      if (iVar9 == 0) {
        iVar9 = cpu_support_x86_avx_vnni();
        bVar39 = iVar9 != 0;
      }
      iVar9 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar39 ^ 1U | iVar9 != 0)) {
        if (iVar13 < 0x10) {
          if (iVar13 < 8) {
            if (iVar13 < 4) {
              iVar22 = (uint)(1 < iVar13) * 4 + 4;
            }
            else {
              iVar22 = 0x10;
            }
          }
          else {
            iVar22 = 0x20;
          }
        }
        else {
          iVar22 = 0x40;
        }
        iVar22 = iVar22 + iVar10;
      }
    }
    Mat::create(&this->AT_data,iVar22 * iVar13,((int)local_f0 + iVar10 + -1) / iVar10,iVar37,1,
                (Allocator *)0x0);
    if (((this->AT_data).data != (void *)0x0) &&
       ((long)(this->AT_data).c * (this->AT_data).cstep != 0)) {
      pMVar1 = &(this->super_Gemm).A_data;
      if (iVar37 < 1) {
        iVar37 = 0;
      }
      for (iVar13 = 0; iVar13 != iVar37; iVar13 = iVar13 + 1) {
        iVar22 = TILE_M * iVar13;
        local_88 = CONCAT44(local_88._4_4_,(int)local_98 - iVar22);
        lVar17 = (long)iVar22;
        local_90 = lVar17 + 1;
        for (iVar9 = 0; iVar34 = (int)local_f0 - iVar9, iVar34 != 0 && iVar9 <= (int)local_f0;
            iVar9 = iVar9 + TILE_K) {
          max_ii = (int)local_88;
          if (TILE_M < (int)local_88) {
            max_ii = TILE_M;
          }
          if (iVar10 < iVar34) {
            iVar34 = iVar10;
          }
          local_e0.elemsize = (pGVar19->AT_data).elemsize;
          local_e0.w = (pGVar19->AT_data).w;
          local_e0.cstep = (size_t)local_e0.w;
          local_e0.elempack = (pGVar19->AT_data).elempack;
          local_e0.allocator = (pGVar19->AT_data).allocator;
          local_e0.data =
               (void *)((long)(pGVar19->AT_data).data +
                       local_e0.elemsize * local_e0.cstep * (long)(iVar9 / iVar10) +
                       (long)(iVar22 / TILE_M) * (pGVar19->AT_data).cstep * local_e0.elemsize);
          local_e0.refcount = (int *)0x0;
          local_e0.dims = 2;
          local_e0.h = 1;
          local_e0.d = 1;
          local_e0.c = 1;
          if ((pGVar19->super_Gemm).transA == 0) {
            pack_A_tile_int8(pMVar1,&local_e0,iVar22,max_ii,iVar9,iVar34);
          }
          else {
            iVar10 = cpu_support_x86_avx_vnni_int8();
            if (iVar10 == 0) {
              iVar10 = cpu_support_x86_avx_vnni();
              if (iVar10 == 0) {
                iVar10 = cpu_support_x86_avx2();
                if (iVar10 == 0) {
                  iVar10 = (pGVar19->super_Gemm).A_data.w;
                  lVar11 = (long)iVar10;
                  lVar29 = (long)iVar9;
                  lVar28 = (long)(iVar10 * 2);
                  local_80 = (long)max_ii;
                  local_140 = (iVar10 + 2) + lVar17;
                  local_160 = lVar17 + lVar11;
                  local_158 = local_90;
                  pauVar14 = (undefined1 (*) [16])local_e0.data;
                  lVar18 = (iVar10 + 1) + lVar17;
                  lVar31 = lVar17;
                  lVar36 = (iVar10 + 3) + lVar17;
                  for (uVar23 = 0; lVar16 = lVar36, lVar26 = lVar18, (long)(uVar23 | 3) < local_80;
                      uVar23 = uVar23 + 4) {
                    pvVar5 = (pGVar19->super_Gemm).A_data.data;
                    lVar20 = (pGVar19->super_Gemm).A_data.w * lVar29 *
                             (pGVar19->super_Gemm).A_data.elemsize;
                    lVar18 = (long)pvVar5 + lVar31;
                    lVar33 = lVar16 + (long)pvVar5;
                    lVar36 = (long)pvVar5 + local_140;
                    lVar38 = (long)pvVar5 + lVar26;
                    lVar25 = (long)pvVar5 + local_160;
                    puVar15 = (undefined1 *)((long)pvVar5 + lVar20 + local_158);
                    for (iVar10 = 1; iVar10 < iVar34; iVar10 = iVar10 + 2) {
                      (*pauVar14)[0] = *(undefined1 *)(lVar18 + lVar20);
                      (*pauVar14)[1] = *(undefined1 *)(lVar25 + lVar20);
                      (*pauVar14)[2] = *(undefined1 *)(lVar18 + 1 + lVar20);
                      (*pauVar14)[3] = *(undefined1 *)(lVar38 + lVar20);
                      (*pauVar14)[4] = *(undefined1 *)(lVar18 + 2 + lVar20);
                      (*pauVar14)[5] = *(undefined1 *)(lVar36 + lVar20);
                      (*pauVar14)[6] = *(undefined1 *)(lVar18 + 3 + lVar20);
                      (*pauVar14)[7] = *(undefined1 *)(lVar33 + lVar20);
                      pauVar14 = (undefined1 (*) [16])(*pauVar14 + 8);
                      lVar18 = lVar18 + lVar28;
                      lVar33 = lVar33 + lVar28;
                      lVar36 = lVar36 + lVar28;
                      lVar38 = lVar38 + lVar28;
                      lVar25 = lVar25 + lVar28;
                      puVar15 = puVar15 + lVar28;
                    }
                    for (iVar10 = iVar10 + -1; iVar10 < iVar34; iVar10 = iVar10 + 1) {
                      (*pauVar14)[0] = puVar15[-1];
                      (*pauVar14)[1] = *puVar15;
                      (*pauVar14)[2] = puVar15[1];
                      (*pauVar14)[3] = puVar15[2];
                      pauVar14 = (undefined1 (*) [16])(*pauVar14 + 4);
                      puVar15 = puVar15 + lVar11;
                    }
                    lVar31 = lVar31 + 4;
                    local_140 = local_140 + 4;
                    local_160 = local_160 + 4;
                    local_158 = local_158 + 4;
                    pGVar19 = local_e8;
                    lVar18 = lVar26 + 4;
                    lVar36 = lVar16 + 4;
                    local_108 = lVar16;
                    local_100 = lVar26;
                  }
                  for (; (long)(uVar23 | 1) < local_80; uVar23 = uVar23 + 2) {
                    pvVar5 = (pGVar19->super_Gemm).A_data.data;
                    lVar16 = (pGVar19->super_Gemm).A_data.w * lVar29 *
                             (pGVar19->super_Gemm).A_data.elemsize;
                    lVar18 = (long)pvVar5 + lVar31;
                    lVar36 = (long)pvVar5 + lVar26;
                    lVar38 = (long)pvVar5 + local_160;
                    for (iVar10 = 1; iVar10 < iVar34; iVar10 = iVar10 + 2) {
                      (*pauVar14)[0] = *(undefined1 *)(lVar18 + lVar16);
                      (*pauVar14)[1] = *(undefined1 *)(lVar38 + lVar16);
                      (*pauVar14)[2] = *(undefined1 *)(lVar18 + 1 + lVar16);
                      (*pauVar14)[3] = *(undefined1 *)(lVar36 + lVar16);
                      pauVar14 = (undefined1 (*) [16])(*pauVar14 + 4);
                      lVar18 = lVar18 + lVar28;
                      lVar36 = lVar36 + lVar28;
                      lVar38 = lVar38 + lVar28;
                    }
                    for (iVar10 = iVar10 + -1; iVar10 < iVar34; iVar10 = iVar10 + 1) {
                      (*pauVar14)[0] = *(undefined1 *)(lVar18 + lVar16);
                      (*pauVar14)[1] = *(undefined1 *)(lVar18 + 1 + lVar16);
                      pauVar14 = (undefined1 (*) [16])(*pauVar14 + 2);
                      lVar16 = lVar16 + lVar11;
                    }
                    lVar31 = lVar31 + 2;
                    lVar26 = lVar26 + 2;
                    local_160 = local_160 + 2;
                  }
                  if (iVar34 < 1) {
                    iVar34 = 0;
                  }
                  for (; (long)uVar23 < local_80; uVar23 = uVar23 + 1) {
                    puVar15 = (undefined1 *)
                              ((long)(pGVar19->super_Gemm).A_data.data +
                              lVar17 + uVar23 + (pGVar19->super_Gemm).A_data.w * lVar29 *
                                                (pGVar19->super_Gemm).A_data.elemsize);
                    iVar10 = iVar34;
                    while (bVar39 = iVar10 != 0, iVar10 = iVar10 + -1, bVar39) {
                      (*pauVar14)[0] = *puVar15;
                      pauVar14 = (undefined1 (*) [16])(*pauVar14 + 1);
                      puVar15 = puVar15 + lVar11;
                    }
                  }
                }
                else {
                  transpose_pack_A_tile_int8_avx2(pMVar1,&local_e0,iVar22,max_ii,iVar9,iVar34);
                }
              }
              else {
                transpose_pack_A_tile_int8_avxvnni(pMVar1,&local_e0,iVar22,max_ii,iVar9,iVar34);
              }
            }
            else {
              transpose_pack_A_tile_int8_avxvnniint8(pMVar1,&local_e0,iVar22,max_ii,iVar9,iVar34);
            }
          }
          if (local_e0.refcount != (int *)0x0) {
            LOCK();
            *local_e0.refcount = *local_e0.refcount + -1;
            UNLOCK();
            if (*local_e0.refcount == 0) {
              if (local_e0.allocator == (Allocator *)0x0) {
                free(local_e0.data);
              }
              else {
                (*(local_e0.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          iVar10 = TILE_K;
        }
      }
      if (local_f8->lightmode != false) {
        piVar12 = (pGVar19->super_Gemm).A_data.refcount;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            pAVar6 = (pGVar19->super_Gemm).A_data.allocator;
            if (pAVar6 == (Allocator *)0x0) {
              free((pGVar19->super_Gemm).A_data.data);
            }
            else {
              (*pAVar6->_vptr_Allocator[3])();
            }
          }
        }
        (pGVar19->super_Gemm).A_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).A_data.refcount + 4) =
             (undefined1  [16])0x0;
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        (pGVar19->super_Gemm).A_data.dims = 0;
        (pGVar19->super_Gemm).A_data.w = 0;
        (pGVar19->super_Gemm).A_data.h = 0;
        (pGVar19->super_Gemm).A_data.d = 0;
        (pGVar19->super_Gemm).A_data.c = 0;
      }
      goto LAB_00475788;
    }
LAB_00476380:
    iVar10 = -100;
  }
  return iVar10;
}

Assistant:

int Gemm_x86_avx::create_pipeline_int8(const Option& opt)
{
    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

#if NCNN_AVX512VNNI || NCNN_AVXVNNI
        bool has_w_shift = false;
        if (TILE_K >= 4)
        {
            has_w_shift = ncnn::cpu_support_x86_avx512_vnni() || ncnn::cpu_support_x86_avx_vnni();
#if NCNN_AVXVNNIINT8
            if (ncnn::cpu_support_x86_avx_vnni_int8())
                has_w_shift = false;
#endif // NCNN_AVXVNNIINT8
        }
        if (has_w_shift)
        {
            int w_shift_count = TILE_M >= 16 ? 16 : TILE_M >= 8 ? 8 : TILE_M >= 4 ? 4 : TILE_M >= 2 ? 2 : 1;
            AT_data.create((TILE_K + w_shift_count * 4) * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        else
#endif // NCNN_AVX512VNNI || NCNN_AVXVNNI
        {
            AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            A_data.release();
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 1u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_N; ppj++)
        {
            const int j = ppj * TILE_N;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_jj = std::min((N - j), TILE_N);
                const int max_kk = std::min((K - k), TILE_K);

                Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (transB)
                {
                    pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
                else
                {
                    transpose_pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            B_data.release();
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

        if (opt.lightmode)
            C_data.release();
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}